

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_d8556d::FeaturePlaceHolderExpander::ExpandVariable
          (string *__return_storage_ptr__,FeaturePlaceHolderExpander *this,string *variable)

{
  bool bVar1;
  
  if (this->Library != (string *)0x0) {
    bVar1 = std::operator==(variable,"LIBRARY");
    if (bVar1) {
      variable = this->Library;
      goto LAB_002e928e;
    }
  }
  if (this->LibItem != (string *)0x0) {
    bVar1 = std::operator==(variable,"LIB_ITEM");
    if (bVar1) {
      variable = this->LibItem;
      goto LAB_002e928e;
    }
  }
  if (this->LinkItem != (string *)0x0) {
    bVar1 = std::operator==(variable,"LINK_ITEM");
    if (bVar1) {
      variable = this->LinkItem;
    }
  }
LAB_002e928e:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)variable);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandVariable(std::string const& variable) override
  {
    if (this->Library != nullptr && variable == "LIBRARY") {
      return *this->Library;
    }
    if (this->LibItem != nullptr && variable == "LIB_ITEM") {
      return *this->LibItem;
    }
    if (this->LinkItem != nullptr && variable == "LINK_ITEM") {
      return *this->LinkItem;
    }

    return variable;
  }